

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_hello(ptls_t *tls,ptls_iovec_t message)

{
  ptls_iovec_t pVar1;
  uint8_t *msg;
  undefined1 auStack_68 [4];
  int ret;
  ptls_iovec_t ecdh_secret;
  st_ptls_server_hello_t sh;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  msg = message.base;
  memset(auStack_68,0,0x10);
  message_local.len._4_4_ =
       decode_server_hello(tls,(st_ptls_server_hello_t *)&ecdh_secret.len,msg + 4,msg + message.len)
  ;
  if ((message_local.len._4_4_ == 0) &&
     ((sh.random._24_8_ == 0 ||
      (pVar1.len = (size_t)sh.peerkey.base, pVar1.base = (uint8_t *)sh.random._24_8_,
      message_local.len._4_4_ =
           (*((tls->field_7).client.key_exchange.ctx)->on_exchange)
                     ((tls->field_7).client.key_exchange.ctx,(ptls_iovec_t *)auStack_68,pVar1),
      message_local.len._4_4_ == 0)))) {
    if (((char)((tls->field_7).client.field_0x20 << 7) < '\0') &&
       (-1 < (char)((tls->field_7).client.field_0x20 << 5))) {
      key_schedule_reset_psk(tls->key_schedule);
    }
    key_schedule_update_hash(tls->key_schedule,msg,message.len);
    message_local.len._4_4_ = key_schedule_extract(tls->key_schedule,_auStack_68);
    if (((message_local.len._4_4_ == 0) &&
        (message_local.len._4_4_ =
              setup_traffic_protection(tls,tls->cipher_suite,1,"client handshake traffic secret"),
        message_local.len._4_4_ == 0)) &&
       (message_local.len._4_4_ =
             setup_traffic_protection(tls,tls->cipher_suite,0,"server handshake traffic secret"),
       message_local.len._4_4_ == 0)) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
      message_local.len._4_4_ = 0x202;
    }
  }
  return message_local.len._4_4_;
}

Assistant:

static int client_handle_hello(ptls_t *tls, ptls_iovec_t message)
{
    struct st_ptls_server_hello_t sh;
    ptls_iovec_t ecdh_secret = {NULL};
    int ret;

    if ((ret = decode_server_hello(tls, &sh, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        return ret;

    if (sh.peerkey.base != NULL) {
        if ((ret = tls->client.key_exchange.ctx->on_exchange(tls->client.key_exchange.ctx, &ecdh_secret, sh.peerkey)) != 0)
            return ret;
    }

    if (tls->client.offered_psk && !tls->client.is_psk)
        key_schedule_reset_psk(tls->key_schedule);
    key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    if ((ret = key_schedule_extract(tls->key_schedule, ecdh_secret)) != 0)
        return ret;
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 1, "client handshake traffic secret")) != 0)
        return ret;
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 0, "server handshake traffic secret")) != 0)
        return ret;

    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
    return PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
}